

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.hpp
# Opt level: O2

void duckdb::StandardErrorOfTheMeanOperation::Finalize<double,duckdb::StddevState>
               (StddevState *state,double *target,AggregateFinalizeData *finalize_data)

{
  uint64_t uVar1;
  char cVar2;
  OutOfRangeException *this;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  allocator local_39;
  string local_38 [32];
  
  uVar1 = state->count;
  if (uVar1 == 0) {
    AggregateFinalizeData::ReturnNull(finalize_data);
    return;
  }
  auVar4._8_4_ = (int)(uVar1 >> 0x20);
  auVar4._0_8_ = uVar1;
  auVar4._12_4_ = 0x45300000;
  dVar3 = state->dsquared /
          ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  auVar5._0_8_ = (double)CONCAT44(0x43300000,(int)state->count);
  auVar5._8_4_ = (int)(state->count >> 0x20);
  auVar5._12_4_ = 0x45300000;
  dVar3 = dVar3 / SQRT((auVar5._8_8_ - 1.9342813113834067e+25) + (auVar5._0_8_ - 4503599627370496.0)
                      );
  *target = dVar3;
  cVar2 = duckdb::Value::DoubleIsFinite(dVar3);
  if (cVar2 != '\0') {
    return;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_38,"SEM is out of range!",&local_39);
  duckdb::OutOfRangeException::OutOfRangeException(this,local_38);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			target = sqrt(state.dsquared / state.count) / sqrt((state.count));
			if (!Value::DoubleIsFinite(target)) {
				throw OutOfRangeException("SEM is out of range!");
			}
		}
	}